

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::OnReturnCall(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result RVar1;
  Result RVar2;
  Enum EVar3;
  Result RVar4;
  Label *in_RAX;
  Label *local_28;
  Label *func_label;
  
  local_28 = in_RAX;
  RVar1 = PopAndCheckSignature(this,param_types,"return_call");
  RVar2 = GetLabel(this,(int)((ulong)((long)(this->label_stack_).
                                            super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->label_stack_).
                                           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        0x38e38e39 - 1,&local_28);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    RVar2 = CheckReturnSignature
                      (this,result_types,&local_28->result_types,(char *)(ulong)RVar2.enum_);
    RVar4 = SetUnreachable(this);
    EVar3 = (Enum)((RVar4.enum_ == Error || RVar1.enum_ == Error) || RVar2.enum_ == Error);
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::OnReturnCall(const TypeVector& param_types,
                                 const TypeVector& result_types) {
  Result result = PopAndCheckSignature(param_types, "return_call");
  Label* func_label;
  CHECK_RESULT(GetThisFunctionLabel(&func_label));
  result |= CheckReturnSignature(result_types, func_label->result_types,
                                 "return_call");

  CHECK_RESULT(SetUnreachable());
  return result;
}